

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

PHYSFS_File * PHYSFS_openRead(char *_fname)

{
  DirHandle *h;
  void *pvVar1;
  _func_PHYSFS_Io_ptr_void_ptr_char_ptr *p_Var2;
  _func_void_PHYSFS_Io_ptr *p_Var3;
  PHYSFS_uint64 PVar4;
  undefined8 uVar5;
  PHYSFS_ErrorCode errcode;
  int iVar6;
  FileHandle *pFVar7;
  size_t sVar8;
  char *pcVar9;
  PHYSFS_Io *pPVar10;
  undefined1 *puVar11;
  undefined8 *puVar12;
  size_t len;
  undefined1 *ptr;
  char *dst;
  DirHandle **ppDVar13;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  char *local_40;
  char *arcfname;
  
  puVar11 = auStack_48;
  if (_fname == (char *)0x0) {
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
  }
  else {
    if ((magicStream == (FileHandle *)0x0) || (magicStream->forReading == '\0')) {
      uStack_50 = 0x109283;
      __PHYSFS_platformGrabMutex(stateLock);
      if (searchPath == (DirHandle *)0x0) {
        puVar12 = &uStack_50;
        uStack_50 = 0xb;
      }
      else {
        uStack_50 = 0x109295;
        sVar8 = strlen(_fname);
        len = longest_root + sVar8 + 1;
        if (len < 0x100) {
          puVar11 = auStack_48 + -(longest_root + sVar8 + 0x18 & 0xfffffffffffffff0);
          ptr = puVar11;
        }
        else {
          ptr = (undefined1 *)0x0;
        }
        *(undefined8 *)(puVar11 + -8) = 0x1092da;
        pcVar9 = (char *)__PHYSFS_initSmallAlloc(ptr,len);
        if (pcVar9 != (char *)0x0) {
          dst = pcVar9 + longest_root;
          *(undefined8 *)(puVar11 + -8) = 0x1092f7;
          iVar6 = sanitizePlatformIndependentPath(_fname,dst);
          if (iVar6 == 0) {
            pFVar7 = (FileHandle *)0x0;
          }
          else {
            pFVar7 = (FileHandle *)0x0;
            ppDVar13 = &searchPath;
            arcfname = pcVar9;
            while (h = *ppDVar13, pcVar9 = arcfname, h != (DirHandle *)0x0) {
              local_40 = dst;
              *(undefined8 *)(puVar11 + -8) = 0x109329;
              iVar6 = verifyPath(h,&local_40,0);
              pcVar9 = local_40;
              if (iVar6 != 0) {
                pvVar1 = h->opaque;
                p_Var2 = h->funcs->openRead;
                *(undefined8 *)(puVar11 + -8) = 0x10933b;
                pPVar10 = (*p_Var2)(pvVar1,pcVar9);
                if (pPVar10 != (PHYSFS_Io *)0x0) {
                  *(undefined8 *)(puVar11 + -8) = 0x40;
                  PVar4 = *(PHYSFS_uint64 *)(puVar11 + -8);
                  *(undefined8 *)(puVar11 + -8) = 0x109385;
                  pFVar7 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(PVar4);
                  if (pFVar7 == (FileHandle *)0x0) {
                    p_Var3 = pPVar10->destroy;
                    *(undefined8 *)(puVar11 + -8) = 0x109394;
                    (*p_Var3)(pPVar10);
                    *(undefined8 *)(puVar11 + -8) = 2;
                    uVar5 = *(undefined8 *)(puVar11 + -8);
                    *(undefined8 *)(puVar11 + -8) = 0x10939c;
                    PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar5);
                  }
                  *(undefined8 *)&pFVar7->forReading = 0;
                  pFVar7->dirHandle = (DirHandle *)0x0;
                  pFVar7->buffill = 0;
                  pFVar7->bufpos = 0;
                  pFVar7->buffer = (PHYSFS_uint8 *)0x0;
                  pFVar7->bufsize = 0;
                  pFVar7->io = pPVar10;
                  pFVar7->forReading = '\x01';
                  pFVar7->dirHandle = h;
                  pFVar7->next = openReadList;
                  pcVar9 = arcfname;
                  openReadList = pFVar7;
                  break;
                }
              }
              ppDVar13 = &h->next;
            }
          }
          *(undefined8 *)(puVar11 + -8) = 0x1093d8;
          __PHYSFS_platformReleaseMutex(stateLock);
          if (*(long *)(pcVar9 + -8) != 0) {
            *(undefined8 *)(puVar11 + -8) = 0x1093ec;
            (*__PHYSFS_AllocatorHooks.Free)(pcVar9 + -8);
            return (PHYSFS_File *)pFVar7;
          }
          return (PHYSFS_File *)pFVar7;
        }
        puVar12 = (undefined8 *)(puVar11 + -8);
        *(undefined8 *)(puVar11 + -8) = 2;
      }
      uVar5 = *puVar12;
      *puVar12 = 0x109355;
      PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar5);
      *puVar12 = 0x109361;
      __PHYSFS_platformReleaseMutex(stateLock);
      return (PHYSFS_File *)0x0;
    }
    uStack_50 = 0x10923d;
    pFVar7 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
    if (pFVar7 != (FileHandle *)0x0) {
      pFVar7->io = (PHYSFS_Io *)0x0;
      *(undefined8 *)&pFVar7->forReading = 0;
      pFVar7->bufsize = 0;
      pFVar7->buffill = 0;
      pFVar7->dirHandle = (DirHandle *)0x0;
      pFVar7->buffer = (PHYSFS_uint8 *)0x0;
      pFVar7->bufpos = 0;
      pFVar7->forReading = '\x01';
      pFVar7->next = openReadList;
      openReadList = pFVar7;
      return (PHYSFS_File *)pFVar7;
    }
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
  }
  uStack_50 = 0x1092ca;
  PHYSFS_setErrorCode(errcode);
  return (PHYSFS_File *)0x0;
}

Assistant:

PHYSFS_File *PHYSFS_openRead(const char *_fname)
{
    FileHandle *fh = NULL;
    char *allocated_fname;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    if (magicStream && magicStream->forReading)
    {
        /* magic stream replay: file opens are NOPs, so
           we'll create a dummy file handle. */
        fh = (FileHandle *)allocator.Malloc(sizeof(FileHandle));
        if (fh == NULL)
        {
            PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
            return NULL;
        } /* if */

        memset(fh, '\0', sizeof(FileHandle));
        fh->io = 0;
        fh->forReading = 1;
        fh->dirHandle = 0;
        fh->next = openReadList;
        openReadList = fh;

        return ((PHYSFS_File *)fh);
    } /* if */

    __PHYSFS_platformGrabMutex(stateLock);

    BAIL_IF_MUTEX(!searchPath, PHYSFS_ERR_NOT_FOUND, stateLock, 0);

    len = strlen(_fname) + longest_root + 1;
    allocated_fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    fname = allocated_fname + longest_root;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        PHYSFS_Io *io = NULL;
        DirHandle *i;

        for (i = searchPath; i != NULL; i = i->next)
        {
            char *arcfname = fname;
            if (verifyPath(i, &arcfname, 0))
            {
                io = i->funcs->openRead(i->opaque, arcfname);
                if (io)
                    break;
            } /* if */
        } /* for */

        if (io)
        {
            fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
            if (fh == NULL)
            {
                io->destroy(io);
                PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
            } /* if */

            memset(fh, '\0', sizeof (FileHandle));
            fh->io = io;
            fh->forReading = 1;
            fh->dirHandle = i;
            fh->next = openReadList;
            openReadList = fh;
        } /* if */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);
    return ((PHYSFS_File *) fh);
}